

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O2

LinkIndex __thiscall
iDynTree::Traversal::getChildLinkIndexFromJointIndex(Traversal *this,Model *model,JointIndex jntIdx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  IJoint *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LinkIndex LVar5;
  
  pIVar4 = Model::getJoint(model,jntIdx);
  LVar5 = LINK_INVALID_INDEX;
  if (pIVar4 != (IJoint *)0x0) {
    iVar2 = (*pIVar4->_vptr_IJoint[7])(pIVar4);
    iVar3 = (*pIVar4->_vptr_IJoint[8])(pIVar4);
    bVar1 = isParentOf(this,CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
    LVar5 = CONCAT44(extraout_var,iVar2);
    if (bVar1) {
      LVar5 = CONCAT44(extraout_var_00,iVar3);
    }
  }
  return LVar5;
}

Assistant:

LinkIndex Traversal::getChildLinkIndexFromJointIndex(const Model& model, const JointIndex jntIdx) const
{
    // Get the two links connected by this joint
    IJointConstPtr jnt = model.getJoint(jntIdx);
    if (!jnt)
    {
        return LINK_INVALID_INDEX;
    }

    LinkIndex link1 = jnt->getFirstAttachedLink();
    LinkIndex link2 = jnt->getSecondAttachedLink();

    // Get the traversal index of the child link (according to the traversal)
    LinkIndex childLink;
    if( this->isParentOf(link1,link2) )
    {
        childLink = link2;
    }
    else
    {
        childLink = link1;
    }

    return childLink;
}